

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_ptr.h
# Opt level: O3

copy_ptr<cppcms::json::value::_data> * __thiscall
booster::copy_ptr<cppcms::json::value::_data>::operator=
          (copy_ptr<cppcms::json::value::_data> *this,copy_ptr<cppcms::json::value::_data> *other)

{
  variant *this_00;
  copy_ptr<cppcms::json::value::_data> tmp;
  copy_ptr<cppcms::json::value::_data> local_20;
  
  if (this != other) {
    copy_ptr(&local_20,other);
    this_00 = &this->ptr_->value_;
    this->ptr_ = (_data *)local_20;
    if (this_00 != (variant *)0x0) {
      local_20.ptr_ = (_data *)this_00;
      cppcms::json::variant::destroy(this_00);
      operator_delete(this_00);
    }
  }
  return this;
}

Assistant:

copy_ptr const &operator=(copy_ptr const &other)
		{
			if(this != &other) {
				copy_ptr tmp(other);
				swap(tmp);
			}
			return *this;
		}